

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_address.cpp
# Opt level: O0

void __thiscall
AddressApi_ParseOutputDescriptor_Test::TestBody(AddressApi_ParseOutputDescriptor_Test *this)

{
  initializer_list<TestCfdAddressApiDescriptorData> __l;
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  exception *e;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TestCfdAddressApiDescriptorData test_data;
  iterator __end1;
  iterator __begin1;
  vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
  *__range1;
  AddressApi factory;
  DescriptorScriptData data;
  vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
  g_test_cfd_descriptor_data;
  DescriptorScriptData *in_stack_ffffffffffffe618;
  DescriptorScriptData *in_stack_ffffffffffffe620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
  *in_stack_ffffffffffffe630;
  char *in_stack_ffffffffffffe638;
  TestCfdAddressApiDescriptorData *in_stack_ffffffffffffe648;
  DescriptorScriptData *in_stack_ffffffffffffe650;
  undefined7 in_stack_ffffffffffffe658;
  undefined1 in_stack_ffffffffffffe65f;
  size_type in_stack_ffffffffffffe660;
  string *local_18b8;
  AssertHelper local_13f0;
  Message local_13e8;
  AssertionResult local_13e0;
  AssertHelper local_13d0;
  Message local_13c8;
  AssertionResult local_13c0;
  AssertHelper local_13b0;
  Message local_13a8;
  AssertionResult local_13a0;
  AssertHelper local_1390;
  Message local_1388;
  string local_1380 [32];
  AssertionResult local_1360;
  AssertHelper local_1350;
  Message local_1348;
  AssertionResult local_1340;
  AssertHelper local_1330;
  Message local_1328;
  string local_1320 [32];
  AssertionResult local_1300;
  AssertHelper local_12f0;
  Message local_12e8;
  AssertionResult local_12e0;
  AssertHelper local_12d0;
  Message local_12c8;
  string local_12c0 [32];
  AssertionResult local_12a0;
  AssertHelper local_1290;
  Message local_1288;
  AssertionResult local_1280;
  allocator local_1269;
  string local_1268 [32];
  string local_1248 [824];
  string local_f10 [32];
  uint local_ef0;
  TestCfdAddressApiDescriptorData *local_e48;
  __normal_iterator<TestCfdAddressApiDescriptorData_*,_std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>_>
  local_e40;
  undefined1 *local_e38;
  AddressApi local_e29 [832];
  undefined1 local_ae9;
  undefined1 local_ae8;
  undefined1 local_ae7;
  undefined1 local_ae6;
  undefined1 local_ae5;
  allocator local_ae4;
  allocator local_ae3;
  allocator local_ae2;
  allocator local_ae1;
  allocator local_ae0;
  undefined1 local_adf;
  undefined1 local_ade;
  undefined1 local_add;
  undefined1 local_adc;
  allocator local_adb;
  allocator local_ada;
  allocator local_ad9;
  allocator local_ad8;
  allocator local_ad7;
  undefined1 local_ad6;
  undefined1 local_ad5;
  undefined1 local_ad4;
  undefined1 local_ad3;
  allocator local_ad2;
  allocator local_ad1;
  allocator local_ad0;
  allocator local_acf;
  allocator local_ace;
  undefined1 local_acd;
  undefined1 local_acc;
  undefined1 local_acb;
  undefined1 local_aca;
  allocator local_ac9;
  allocator local_ac8;
  allocator local_ac7;
  allocator local_ac6;
  allocator local_ac5;
  undefined1 local_ac4;
  undefined1 local_ac3;
  undefined1 local_ac2;
  undefined1 local_ac1;
  allocator local_ac0;
  allocator local_abf;
  allocator local_abe;
  allocator local_abd;
  allocator local_abc;
  undefined1 local_abb;
  undefined1 local_aba;
  undefined1 local_ab9;
  undefined1 local_ab8;
  allocator local_ab7;
  allocator local_ab6;
  allocator local_ab5;
  allocator local_ab4;
  allocator local_ab3;
  undefined1 local_ab2;
  undefined1 local_ab1;
  undefined1 local_ab0;
  undefined1 local_aaf;
  allocator local_aae;
  allocator local_aad;
  allocator local_aac;
  allocator local_aab;
  allocator local_aaa;
  undefined1 local_aa9;
  undefined1 local_aa8;
  undefined1 local_aa7;
  undefined1 local_aa6;
  allocator local_aa5;
  allocator local_aa4;
  allocator local_aa3;
  allocator local_aa2;
  allocator local_aa1;
  undefined1 local_aa0;
  undefined1 local_a9f;
  undefined1 local_a9e;
  undefined1 local_a9d;
  allocator local_a9c;
  allocator local_a9b;
  allocator local_a9a;
  allocator local_a99;
  allocator local_a98;
  undefined1 local_a97;
  undefined1 local_a96;
  undefined1 local_a95;
  undefined1 local_a94;
  allocator local_a93;
  allocator local_a92;
  allocator local_a91;
  allocator local_a90;
  allocator local_a8f;
  undefined1 local_a8e;
  undefined1 local_a8d;
  undefined1 local_a8c;
  undefined1 local_a8b;
  allocator local_a8a;
  allocator local_a89;
  allocator local_a88;
  allocator local_a87;
  allocator local_a86;
  undefined1 local_a85;
  undefined1 local_a84;
  undefined1 local_a83;
  undefined1 local_a82;
  allocator local_a81;
  allocator local_a80;
  allocator local_a7f;
  allocator local_a7e;
  allocator local_a7d;
  undefined1 local_a7c;
  undefined1 local_a7b;
  undefined1 local_a7a;
  undefined1 local_a79;
  allocator local_a78;
  allocator local_a77;
  allocator local_a76;
  allocator local_a75 [20];
  allocator local_a61;
  string *local_a60;
  string local_a58 [32];
  undefined4 local_a38;
  undefined4 local_a34;
  string local_a30 [32];
  undefined4 local_a10;
  string local_a08 [32];
  undefined4 local_9e8;
  string local_9e0 [32];
  undefined4 local_9c0;
  string local_9b8 [32];
  undefined4 local_998;
  string local_990 [32];
  undefined4 local_970;
  undefined4 local_96c;
  string asStack_968 [32];
  undefined4 local_948;
  string asStack_940 [32];
  undefined4 local_920;
  string asStack_918 [32];
  undefined4 local_8f8;
  string asStack_8f0 [32];
  undefined4 local_8d0;
  string local_8c8 [32];
  undefined4 local_8a8;
  undefined4 local_8a4;
  string asStack_8a0 [32];
  undefined4 local_880;
  string asStack_878 [32];
  undefined4 local_858;
  string asStack_850 [32];
  undefined4 local_830;
  string asStack_828 [32];
  undefined4 local_808;
  string local_800 [32];
  undefined4 local_7e0;
  undefined4 local_7dc;
  string asStack_7d8 [32];
  undefined4 local_7b8;
  string asStack_7b0 [32];
  undefined4 local_790;
  string asStack_788 [32];
  undefined4 local_768;
  string asStack_760 [32];
  undefined4 local_740;
  string local_738 [32];
  undefined4 local_718;
  undefined4 local_714;
  string asStack_710 [32];
  undefined4 local_6f0;
  string asStack_6e8 [32];
  undefined4 local_6c8;
  string asStack_6c0 [32];
  undefined4 local_6a0;
  string asStack_698 [32];
  undefined4 local_678;
  string local_670 [32];
  undefined4 local_650;
  undefined4 local_64c;
  string asStack_648 [32];
  undefined4 local_628;
  string asStack_620 [32];
  undefined4 local_600;
  string asStack_5f8 [32];
  undefined4 local_5d8;
  string asStack_5d0 [32];
  undefined4 local_5b0;
  string local_5a8 [32];
  undefined4 local_588;
  undefined4 local_584;
  string asStack_580 [32];
  undefined4 local_560;
  string asStack_558 [32];
  undefined4 local_538;
  string asStack_530 [32];
  undefined4 local_510;
  string asStack_508 [32];
  undefined4 local_4e8;
  string local_4e0 [32];
  undefined4 local_4c0;
  undefined4 local_4bc;
  string asStack_4b8 [32];
  undefined4 local_498;
  string asStack_490 [32];
  undefined4 local_470;
  string asStack_468 [32];
  undefined4 local_448;
  string asStack_440 [32];
  undefined4 local_420;
  string local_418 [32];
  undefined4 local_3f8;
  undefined4 local_3f4;
  string asStack_3f0 [32];
  undefined4 local_3d0;
  string asStack_3c8 [32];
  undefined4 local_3a8;
  string asStack_3a0 [32];
  undefined4 local_380;
  string asStack_378 [32];
  undefined4 local_358;
  string local_350 [32];
  undefined4 local_330;
  undefined4 local_32c;
  string asStack_328 [32];
  undefined4 local_308;
  string asStack_300 [32];
  undefined4 local_2e0;
  string asStack_2d8 [32];
  undefined4 local_2b8;
  string asStack_2b0 [32];
  undefined4 local_290;
  string local_288 [32];
  undefined4 local_268;
  undefined4 local_264;
  string asStack_260 [32];
  undefined4 local_240;
  string asStack_238 [32];
  undefined4 local_218;
  string asStack_210 [32];
  undefined4 local_1f0;
  string asStack_1e8 [32];
  undefined4 local_1c8;
  string local_1c0 [32];
  undefined4 local_1a0;
  undefined4 local_19c;
  string asStack_198 [32];
  undefined4 local_178;
  string asStack_170 [32];
  undefined4 local_150;
  string asStack_148 [32];
  undefined4 local_128;
  string asStack_120 [32];
  undefined4 local_100;
  string local_f8 [32];
  undefined4 local_d8;
  undefined4 local_d4;
  string asStack_d0 [32];
  undefined4 local_b0;
  string asStack_a8 [32];
  undefined4 local_88;
  string asStack_80 [32];
  undefined4 local_60;
  string asStack_58 [32];
  undefined4 local_38;
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_ae9 = 1;
  local_a60 = local_a58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a58,
             "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
             &local_a61);
  local_a7c = 1;
  local_a38 = 0;
  local_a34 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a30,"2102a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397ac",
             local_a75);
  local_a7b = 1;
  local_a10 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a08,"1FoG2386FG2tAJS9acMuiDsKy67aGg9MKz",&local_a76);
  local_a7a = 1;
  local_9e8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e0,"",&local_a77);
  local_a79 = 1;
  local_9c0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9b8,"02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397",
             &local_a78);
  local_998 = 0;
  local_a79 = 0;
  local_a7a = 0;
  local_a7b = 0;
  local_a7c = 0;
  local_a60 = local_990;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_990,"pkh(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)",
             &local_a7d);
  local_a85 = 1;
  local_970 = 0;
  local_96c = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_968,"76a91406afd46bcdfd22ef94ac122aa11f241244a37ecc88ac",&local_a7e);
  local_a84 = 1;
  local_948 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_940,"1cMh228HTCiwS8ZsaakH8A8wze1JR5ZsP",&local_a7f);
  local_a83 = 1;
  local_920 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_918,"",&local_a80);
  local_a82 = 1;
  local_8f8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_8f0,"02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5",
             &local_a81);
  local_8d0 = 0;
  local_a82 = 0;
  local_a83 = 0;
  local_a84 = 0;
  local_a85 = 0;
  local_a60 = local_8c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8c8,"wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)",
             &local_a86);
  local_a8e = 1;
  local_8a8 = 0;
  local_8a4 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_8a0,"00147dd65592d0ab2fe0d0257d571abf032cd9db93dc",&local_a87);
  local_a8d = 1;
  local_880 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_878,"bc1q0ht9tyks4vh7p5p904t340cr9nvahy7u3re7zg",&local_a88);
  local_a8c = 1;
  local_858 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_850,"",&local_a89);
  local_a8b = 1;
  local_830 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_828,"02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9",
             &local_a8a);
  local_808 = 0;
  local_a8b = 0;
  local_a8c = 0;
  local_a8d = 0;
  local_a8e = 0;
  local_a60 = local_800;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_800,
             "sh(wpkh(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))",
             &local_a8f);
  local_a97 = 1;
  local_7e0 = 0;
  local_7dc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_7d8,"a914cc6ffbc0bf31af759451068f90ba7a0272b6b33287",&local_a90);
  local_a96 = 1;
  local_7b8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_7b0,"3LKyvRN6SmYXGBNn8fcQvYxW9MGKtwcinN",&local_a91);
  local_a95 = 1;
  local_790 = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_788,"",&local_a92);
  local_a94 = 1;
  local_768 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_760,"03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556",
             &local_a93);
  local_740 = 0;
  local_a94 = 0;
  local_a95 = 0;
  local_a96 = 0;
  local_a97 = 0;
  local_a60 = local_738;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_738,"combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",
             &local_a98);
  local_aa0 = 1;
  local_718 = 0;
  local_714 = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_710,"0014751e76e8199196d454941c45d1b3a323f1433bd6",&local_a99);
  local_a9f = 1;
  local_6f0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_6e8,"bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",&local_a9a);
  local_a9e = 1;
  local_6c8 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_6c0,"",&local_a9b);
  local_a9d = 1;
  local_6a0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_698,"0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798",
             &local_a9c);
  local_678 = 0;
  local_a9d = 0;
  local_a9e = 0;
  local_a9f = 0;
  local_aa0 = 0;
  local_a60 = local_670;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_670,
             "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
             &local_aa1);
  local_aa9 = 1;
  local_650 = 0;
  local_64c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_648,"a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",&local_aa2);
  local_aa8 = 1;
  local_628 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_620,"39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",&local_aa3);
  local_aa7 = 1;
  local_600 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_5f8,"76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",&local_aa4);
  local_aa6 = 1;
  local_5d8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_5d0,"02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
             &local_aa5);
  local_5b0 = 0;
  local_aa6 = 0;
  local_aa7 = 0;
  local_aa8 = 0;
  local_aa9 = 0;
  local_a60 = local_5a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5a8,
             "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))"
             ,&local_aaa);
  local_ab2 = 1;
  local_588 = 0;
  local_584 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_580,"a914a6a8b030a38762f4c1f5cbe387b61a3c5da5cd2687",&local_aab);
  local_ab1 = 1;
  local_560 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_558,"3GtEB3yg3r5de2cDJG48SkQwxfxJumKQdN",&local_aac);
  local_ab0 = 1;
  local_538 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_530,
             "5221022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a012103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe52ae"
             ,&local_aad);
  local_aaf = 1;
  local_510 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_508,"",&local_aae);
  local_4e8 = 2;
  local_aaf = 0;
  local_ab0 = 0;
  local_ab1 = 0;
  local_ab2 = 0;
  local_a60 = local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4e0,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,&local_ab3);
  local_abb = 1;
  local_4c0 = 0;
  local_4bc = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_4b8,"0020773d709598b76c4e3b575c08aad40658963f9322affc0f8c28d1d9a68d0c944a",
             &local_ab4);
  local_aba = 1;
  local_498 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_490,"bc1qwu7hp9vckakyuw6htsy244qxtztrlyez4l7qlrpg68v6drgvj39qn4zazc",&local_ab5
            );
  local_ab9 = 1;
  local_470 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_468,
             "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c72103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae"
             ,&local_ab6);
  local_ab8 = 1;
  local_448 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_440,"",&local_ab7);
  local_420 = 2;
  local_ab8 = 0;
  local_ab9 = 0;
  local_aba = 0;
  local_abb = 0;
  local_a60 = local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_418,
             "sh(wsh(multi(1,03f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8,03499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))"
             ,&local_abc);
  local_ac4 = 1;
  local_3f8 = 0;
  local_3f4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_3f0,"a914aec509e284f909f769bb7dda299a717c87cc97ac87",&local_abd);
  local_ac3 = 1;
  local_3d0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_3c8,"3Hd7YQStg9gYpEt6hgK14ZHUABxSURzeuQ",&local_abe);
  local_ac2 = 1;
  local_3a8 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_3a0,
             "512103f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa82103499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e42102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e53ae"
             ,&local_abf);
  local_ac1 = 1;
  local_380 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_378,"",&local_ac0);
  local_358 = 1;
  local_ac1 = 0;
  local_ac2 = 0;
  local_ac3 = 0;
  local_ac4 = 0;
  local_a60 = local_350;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_350,"addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",
             &local_ac5);
  local_acd = 1;
  local_330 = 0;
  local_32c = 9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_328,"0020c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d",
             &local_ac6);
  local_acc = 1;
  local_308 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_300,"bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9",&local_ac7
            );
  local_acb = 1;
  local_2e0 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_2d8,"",&local_ac8);
  local_aca = 1;
  local_2b8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_2b0,"",&local_ac9);
  local_290 = 0;
  local_aca = 0;
  local_acb = 0;
  local_acc = 0;
  local_acd = 0;
  local_a60 = local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_288,
             "raw(6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e)#zf2avljj"
             ,&local_ace);
  local_ad6 = 1;
  local_268 = 0;
  local_264 = 10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_260,
             "6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e"
             ,&local_acf);
  local_ad5 = 1;
  local_240 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_238,"",&local_ad0);
  local_ad4 = 1;
  local_218 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_210,"",&local_ad1);
  local_ad3 = 1;
  local_1f0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_1e8,"",&local_ad2);
  local_1c8 = 0;
  local_ad3 = 0;
  local_ad4 = 0;
  local_ad5 = 0;
  local_ad6 = 0;
  local_a60 = local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,
             "sh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))"
             ,&local_ad7);
  local_adf = 1;
  local_1a0 = 0;
  local_19c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_198,"a9148019628fc9b183af5d52ed7dc5c6d56fe6a6325f87",&local_ad8);
  local_ade = 1;
  local_178 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_170,"3DNLpswxUiEVyRnAA6mZSvAt7iG6bCu33f",&local_ad9);
  local_add = 1;
  local_150 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_148,
             "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac"
             ,&local_ada);
  local_adc = 1;
  local_128 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_120,"",&local_adb);
  local_100 = 0;
  local_adc = 0;
  local_add = 0;
  local_ade = 0;
  local_adf = 0;
  local_a60 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f8,
             "sh(wsh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))))"
             ,&local_ae0);
  local_ae8 = 1;
  local_d8 = 0;
  local_d4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_d0,"a914a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa69187",&local_ae1);
  local_ae7 = 1;
  local_b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_a8,"3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt",&local_ae2);
  local_ae6 = 1;
  local_88 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (asStack_80,
             "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac"
             ,&local_ae3);
  local_ae5 = 1;
  local_60 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_58,"",&local_ae4);
  local_38 = 0;
  local_ae5 = 0;
  local_ae6 = 0;
  local_ae7 = 0;
  local_ae8 = 0;
  local_ae9 = 0;
  local_30 = local_a58;
  local_28 = 0xd;
  std::allocator<TestCfdAddressApiDescriptorData>::allocator
            ((allocator<TestCfdAddressApiDescriptorData> *)0x278af9);
  __l._M_array._7_1_ = in_stack_ffffffffffffe65f;
  __l._M_array._0_7_ = in_stack_ffffffffffffe658;
  __l._M_len = in_stack_ffffffffffffe660;
  std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>::
  vector((vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
          *)in_stack_ffffffffffffe650,__l,(allocator_type *)in_stack_ffffffffffffe648);
  std::allocator<TestCfdAddressApiDescriptorData>::~allocator
            ((allocator<TestCfdAddressApiDescriptorData> *)0x278b2d);
  local_18b8 = (string *)&local_30;
  do {
    local_18b8 = local_18b8 + -200;
    TestCfdAddressApiDescriptorData::~TestCfdAddressApiDescriptorData
              ((TestCfdAddressApiDescriptorData *)in_stack_ffffffffffffe620);
  } while (local_18b8 != local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae4);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae3);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae2);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_adb);
  std::allocator<char>::~allocator((allocator<char> *)&local_ada);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad7);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad2);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_acf);
  std::allocator<char>::~allocator((allocator<char> *)&local_ace);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac7);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac6);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac5);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_abf);
  std::allocator<char>::~allocator((allocator<char> *)&local_abe);
  std::allocator<char>::~allocator((allocator<char> *)&local_abd);
  std::allocator<char>::~allocator((allocator<char> *)&local_abc);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab7);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab6);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab5);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab4);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab3);
  std::allocator<char>::~allocator((allocator<char> *)&local_aae);
  std::allocator<char>::~allocator((allocator<char> *)&local_aad);
  std::allocator<char>::~allocator((allocator<char> *)&local_aac);
  std::allocator<char>::~allocator((allocator<char> *)&local_aab);
  std::allocator<char>::~allocator((allocator<char> *)&local_aaa);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa5);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa4);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa3);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa2);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9c);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9b);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9a);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::allocator<char>::~allocator((allocator<char> *)&local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a93);
  std::allocator<char>::~allocator((allocator<char> *)&local_a92);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  std::allocator<char>::~allocator((allocator<char> *)&local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a8f);
  std::allocator<char>::~allocator((allocator<char> *)&local_a8a);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::allocator<char>::~allocator((allocator<char> *)&local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a87);
  std::allocator<char>::~allocator((allocator<char> *)&local_a86);
  std::allocator<char>::~allocator((allocator<char> *)&local_a81);
  std::allocator<char>::~allocator((allocator<char> *)&local_a80);
  std::allocator<char>::~allocator((allocator<char> *)&local_a7f);
  std::allocator<char>::~allocator((allocator<char> *)&local_a7e);
  std::allocator<char>::~allocator((allocator<char> *)&local_a7d);
  std::allocator<char>::~allocator((allocator<char> *)&local_a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_a77);
  std::allocator<char>::~allocator((allocator<char> *)&local_a76);
  std::allocator<char>::~allocator((allocator<char> *)local_a75);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  cfd::DescriptorScriptData::DescriptorScriptData(in_stack_ffffffffffffe650);
  cfd::api::AddressApi::AddressApi(local_e29);
  local_e38 = local_20;
  local_e40._M_current =
       (TestCfdAddressApiDescriptorData *)
       std::
       vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>::
       begin((vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
              *)in_stack_ffffffffffffe618);
  local_e48 = (TestCfdAddressApiDescriptorData *)
              std::
              vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
              ::end((vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>
                     *)in_stack_ffffffffffffe618);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<TestCfdAddressApiDescriptorData_*,_std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>_>
                             *)in_stack_ffffffffffffe620,
                            (__normal_iterator<TestCfdAddressApiDescriptorData_*,_std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>_>
                             *)in_stack_ffffffffffffe618), bVar2) {
    __gnu_cxx::
    __normal_iterator<TestCfdAddressApiDescriptorData_*,_std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>_>
    ::operator*(&local_e40);
    TestCfdAddressApiDescriptorData::TestCfdAddressApiDescriptorData
              ((TestCfdAddressApiDescriptorData *)in_stack_ffffffffffffe650,
               in_stack_ffffffffffffe648);
    uVar1 = local_ef0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1268,"",&local_1269);
    lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    in_stack_ffffffffffffe620 = (DescriptorScriptData *)0x0;
    in_stack_ffffffffffffe618 = (DescriptorScriptData *)0x0;
    cfd::api::AddressApi::ParseOutputDescriptor
              (local_1248,(NetType)local_e29,local_f10,(vector *)(ulong)uVar1,(vector *)local_1268,
               (vector *)0x0,(vector *)0x0);
    cfd::DescriptorScriptData::operator=(in_stack_ffffffffffffe620,in_stack_ffffffffffffe618);
    cfd::DescriptorScriptData::~DescriptorScriptData(in_stack_ffffffffffffe620);
    std::__cxx11::string::~string(local_1268);
    std::allocator<char>::~allocator((allocator<char> *)&local_1269);
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,
               (DescriptorScriptType *)lhs,&in_stack_ffffffffffffe620->type);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1280);
    if (!bVar2) {
      testing::Message::Message(&local_1288);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27a188);
      testing::internal::AssertHelper::AssertHelper
                (&local_1290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xdf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1290,&local_1288);
      testing::internal::AssertHelper::~AssertHelper(&local_1290);
      testing::Message::~Message((Message *)0x27a1eb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27a243);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,lhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe620);
    std::__cxx11::string::~string(local_12c0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_12a0);
    if (!bVar2) {
      testing::Message::Message(&local_12c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27a339);
      testing::internal::AssertHelper::AssertHelper
                (&local_12d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_12d0,&local_12c8);
      testing::internal::AssertHelper::~AssertHelper(&local_12d0);
      testing::Message::~Message((Message *)0x27a39c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27a3f1);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,(uint *)lhs,
               &in_stack_ffffffffffffe620->type);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_12e0);
    if (!bVar2) {
      testing::Message::Message(&local_12e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27a48d);
      testing::internal::AssertHelper::AssertHelper
                (&local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_12f0,&local_12e8);
      testing::internal::AssertHelper::~AssertHelper(&local_12f0);
      testing::Message::~Message((Message *)0x27a4f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27a548);
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,lhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe620);
    std::__cxx11::string::~string(local_1320);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1300);
    if (!bVar2) {
      testing::Message::Message(&local_1328);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27a63e);
      testing::internal::AssertHelper::AssertHelper
                (&local_1330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1330,&local_1328);
      testing::internal::AssertHelper::~AssertHelper(&local_1330);
      testing::Message::~Message((Message *)0x27a6a1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27a6f6);
    testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,(AddressType *)lhs,
               &in_stack_ffffffffffffe620->type);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1340);
    if (!bVar2) {
      testing::Message::Message(&local_1348);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27a792);
      testing::internal::AssertHelper::AssertHelper
                (&local_1350,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1350,&local_1348);
      testing::internal::AssertHelper::~AssertHelper(&local_1350);
      testing::Message::~Message((Message *)0x27a7f5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27a84d);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,lhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe620);
    std::__cxx11::string::~string(local_1380);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1360);
    if (!bVar2) {
      testing::Message::Message(&local_1388);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27a937);
      testing::internal::AssertHelper::AssertHelper
                (&local_1390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1390,&local_1388);
      testing::internal::AssertHelper::~AssertHelper(&local_1390);
      testing::Message::~Message((Message *)0x27a994);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27a9e9);
    testing::internal::EqHelper<false>::
    Compare<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,(DescriptorKeyType *)lhs,
               &in_stack_ffffffffffffe620->type);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_13a0);
    if (!bVar2) {
      testing::Message::Message(&local_13a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27aa7f);
      testing::internal::AssertHelper::AssertHelper
                (&local_13b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_13b0,&local_13a8);
      testing::internal::AssertHelper::~AssertHelper(&local_13b0);
      testing::Message::~Message((Message *)0x27aadc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27ab31);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,lhs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe620);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_13c0);
    if (!bVar2) {
      testing::Message::Message(&local_13c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27abc7);
      testing::internal::AssertHelper::AssertHelper
                (&local_13d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_13d0,&local_13c8);
      testing::internal::AssertHelper::~AssertHelper(&local_13d0);
      testing::Message::~Message((Message *)0x27ac24);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27ac79);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              (in_stack_ffffffffffffe638,(char *)in_stack_ffffffffffffe630,(uint *)lhs,
               &in_stack_ffffffffffffe620->type);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_13e0);
    if (!bVar2) {
      testing::Message::Message(&local_13e8);
      in_stack_ffffffffffffe650 =
           (DescriptorScriptData *)
           testing::AssertionResult::failure_message((AssertionResult *)0x27ad0f);
      testing::internal::AssertHelper::AssertHelper
                (&local_13f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_address.cpp"
                 ,0xe7,(char *)in_stack_ffffffffffffe650);
      testing::internal::AssertHelper::operator=(&local_13f0,&local_13e8);
      testing::internal::AssertHelper::~AssertHelper(&local_13f0);
      testing::Message::~Message((Message *)0x27ad6c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27adc1);
    TestCfdAddressApiDescriptorData::~TestCfdAddressApiDescriptorData
              ((TestCfdAddressApiDescriptorData *)in_stack_ffffffffffffe620);
    __gnu_cxx::
    __normal_iterator<TestCfdAddressApiDescriptorData_*,_std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>_>
    ::operator++(&local_e40);
  }
  cfd::DescriptorScriptData::~DescriptorScriptData(in_stack_ffffffffffffe620);
  std::vector<TestCfdAddressApiDescriptorData,_std::allocator<TestCfdAddressApiDescriptorData>_>::
  ~vector(in_stack_ffffffffffffe630);
  return;
}

Assistant:

TEST(AddressApi, ParseOutputDescriptor) {
  std::vector<TestCfdAddressApiDescriptorData> g_test_cfd_descriptor_data {
    {
      "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptPk,
      "2102a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397ac",
      0,
      "1FoG2386FG2tAJS9acMuiDsKy67aGg9MKz",
      AddressType::kP2shAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397",
      0
    },
    {
      "pkh(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptPkh,
      "76a91406afd46bcdfd22ef94ac122aa11f241244a37ecc88ac",
      0,
      "1cMh228HTCiwS8ZsaakH8A8wze1JR5ZsP",
      AddressType::kP2pkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5",
      0
    },
    {
      "wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptWpkh,
      "00147dd65592d0ab2fe0d0257d571abf032cd9db93dc",
      0,
      "bc1q0ht9tyks4vh7p5p904t340cr9nvahy7u3re7zg",
      AddressType::kP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9",
      0
    },
    {
      "sh(wpkh(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914cc6ffbc0bf31af759451068f90ba7a0272b6b33287",
      0,
      "3LKyvRN6SmYXGBNn8fcQvYxW9MGKtwcinN",
      AddressType::kP2shP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556",
      0
    },
    {
      "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptCombo,
      "0014751e76e8199196d454941c45d1b3a323f1433bd6",
      0,
      "bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",
      AddressType::kP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798",
      0
    },
    {
      "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",
      0,
      "39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",
      AddressType::kP2shP2wshAddress,
      "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
      0
    },
    {
      "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914a6a8b030a38762f4c1f5cbe387b61a3c5da5cd2687",
      0,
      "3GtEB3yg3r5de2cDJG48SkQwxfxJumKQdN",
      AddressType::kP2shAddress,
      "5221022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a012103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe52ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      2
    },
    {
      "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptWsh,
      "0020773d709598b76c4e3b575c08aad40658963f9322affc0f8c28d1d9a68d0c944a",
      0,
      "bc1qwu7hp9vckakyuw6htsy244qxtztrlyez4l7qlrpg68v6drgvj39qn4zazc",
      AddressType::kP2wshAddress,
      "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c72103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      2
    },
    {
      "sh(wsh(multi(1,03f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8,03499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914aec509e284f909f769bb7dda299a717c87cc97ac87",
      0,
      "3Hd7YQStg9gYpEt6hgK14ZHUABxSURzeuQ",
      AddressType::kP2shP2wshAddress,
      "512103f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa82103499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e42102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e53ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      1
    },
    {
      "addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptAddr,
      "0020c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d",
      0,
      "bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9",
      AddressType::kP2wshAddress,
      "",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      0
    },
    {
      "raw(6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e)#zf2avljj",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptRaw,
      "6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e",
      0,
      "",
      AddressType::kP2shAddress,
      "",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      0
    },
    {
      "sh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a9148019628fc9b183af5d52ed7dc5c6d56fe6a6325f87",
      0,
      "3DNLpswxUiEVyRnAA6mZSvAt7iG6bCu33f",
      AddressType::kP2shAddress,
      "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      0
    },
    {
      "sh(wsh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e))))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914a7a9f411001e3e3db96d7f02fc9ab1d0dc6aa69187",
      0,
      "3GyYN9WnJBoMn8M5tuqVcFJq1BvbAcdPAt",
      AddressType::kP2shP2wshAddress,
      "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      0
    }
  };

  DescriptorScriptData data;
  AddressApi factory;
  for (auto test_data : g_test_cfd_descriptor_data) {
    try {
      data = factory.ParseOutputDescriptor(
          test_data.descriptor, test_data.net_type);

      EXPECT_EQ(test_data.type, data.type);
      EXPECT_EQ(test_data.locking_script, data.locking_script.GetHex());
      EXPECT_EQ(test_data.depth, data.depth);
      EXPECT_EQ(test_data.address, data.address.GetAddress());
      EXPECT_EQ(test_data.address_type, data.address_type);
      EXPECT_EQ(test_data.redeem_script, data.redeem_script.GetHex());
      EXPECT_EQ(test_data.key_type, data.key_type);
      EXPECT_EQ(test_data.key, data.key);
      EXPECT_EQ(test_data.multisig_req_sig_num, data.multisig_req_sig_num);
    } catch (const std::exception& e) {
      EXPECT_STREQ("", e.what());
      EXPECT_STREQ("", test_data.descriptor.c_str());
    }
  }
}